

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_double_to_ratio(sexp ctx,double f)

{
  sexp psVar1;
  ulong uVar2;
  sexp num;
  uint uVar3;
  double dVar4;
  sexp local_90;
  double local_88;
  undefined8 uStack_80;
  sexp scale;
  double local_68;
  sexp whole;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_90 = (sexp)0x43e;
  whole = (sexp)&DAT_0000043e;
  scale = (sexp)&DAT_0000043e;
  local_68 = f;
  local_88 = trunc(f);
  if ((local_88 == local_68) && (!NAN(local_88) && !NAN(local_68))) {
    psVar1 = sexp_double_to_bignum(ctx,local_68);
    psVar1 = sexp_bignum_normalize(psVar1);
    return psVar1;
  }
  local_58.var = &local_90;
  local_38.next = &local_58;
  local_58.next = (ctx->value).context.saves;
  local_38.var = &whole;
  local_48.next = &local_38;
  local_48.var = &scale;
  (ctx->value).context.saves = &local_48;
  whole = sexp_double_to_bignum(ctx,local_88);
  local_90 = sexp_fixnum_to_bignum(ctx,(sexp)&DAT_00000001);
  scale = (sexp)&DAT_00000003;
  local_88 = ABS(local_68 - local_88);
  uStack_80 = 0;
  uVar3 = 0;
  while( true ) {
    psVar1 = scale;
    dVar4 = trunc(local_88);
    if (((local_88 == dVar4) && (!NAN(local_88) && !NAN(dVar4))) || (0xe < uVar3)) break;
    psVar1 = sexp_bignum_fxmul(ctx,(sexp)0x0,local_90,10,0);
    local_88 = local_88 * 10.0;
    local_90 = psVar1;
    dVar4 = trunc(local_88 / 10.0);
    dVar4 = local_88 - dVar4 * 10.0;
    uVar2 = (ulong)dVar4;
    local_90 = sexp_bignum_fxadd(ctx,psVar1,
                                 (long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2
                                );
    dVar4 = trunc(local_88);
    local_88 = local_88 - dVar4;
    scale = sexp_mul(ctx,scale,(sexp)&DAT_00000015);
    uVar3 = uVar3 + 1;
  }
  (local_90->value).flonum_bits[0] = -(local_68 < 0.0) | 1;
  num = sexp_bignum_normalize(local_90);
  local_90 = num;
  scale = sexp_bignum_normalize(psVar1);
  local_90 = sexp_make_ratio(ctx,num,scale);
  local_90 = sexp_ratio_normalize(ctx,local_90,(sexp)&DAT_0000003e);
  psVar1 = sexp_add(ctx,local_90,whole);
  (ctx->value).context.saves = local_58.next;
  return psVar1;
}

Assistant:

sexp sexp_double_to_ratio (sexp ctx, double f) {
  int sign, i;
  sexp_gc_var3(res, whole, scale);
  if (f == trunc(f))
    return sexp_bignum_normalize(sexp_double_to_bignum(ctx, f));
  sexp_gc_preserve3(ctx, res, whole, scale);
  whole = sexp_double_to_bignum(ctx, trunc(f));
  res = sexp_fixnum_to_bignum(ctx, SEXP_ZERO);
  scale = SEXP_ONE;
  sign = (f < 0 ? -1 : 1);
  for (i=0, f=fabs(f-trunc(f)); f != trunc(f) && i < 15; i++) {
    res = sexp_bignum_fxmul(ctx, NULL, res, 10, 0);
    f = f * 10;
    res = sexp_bignum_fxadd(ctx, res, (sexp_uint_t)double_10s_digit(f));
    f = f - trunc(f);
    scale = sexp_mul(ctx, scale, SEXP_TEN);
  }
  sexp_bignum_sign(res) = sign;
  res = sexp_bignum_normalize(res);
  scale = sexp_bignum_normalize(scale);
  res = sexp_make_ratio(ctx, res, scale);
  res = sexp_ratio_normalize(ctx, res, SEXP_FALSE);
  res = sexp_add(ctx, res, whole);
  sexp_gc_release3(ctx);
  return res;
}